

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void update_ref_frame_id(AV1Decoder *pbi)

{
  uint uVar1;
  int i;
  long lVar2;
  
  uVar1 = (pbi->common).current_frame.refresh_frame_flags;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    if ((uVar1 >> ((uint)lVar2 & 0x1f) & 1) != 0) {
      (pbi->common).ref_frame_id[lVar2] = (pbi->common).current_frame_id;
      pbi->valid_for_referencing[lVar2] = 1;
    }
  }
  return;
}

Assistant:

static inline void update_ref_frame_id(AV1Decoder *const pbi) {
  AV1_COMMON *const cm = &pbi->common;
  int refresh_frame_flags = cm->current_frame.refresh_frame_flags;
  for (int i = 0; i < REF_FRAMES; i++) {
    if ((refresh_frame_flags >> i) & 1) {
      cm->ref_frame_id[i] = cm->current_frame_id;
      pbi->valid_for_referencing[i] = 1;
    }
  }
}